

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O3

void lshift8(void *blob,int nbytes,int c)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint8_t *k;
  
  if (c != 0) {
    uVar2 = c >> 3;
    if ((int)uVar2 < nbytes) {
      lVar5 = (long)nbytes;
      do {
        lVar1 = lVar5 + -1;
        *(undefined1 *)((long)blob + lVar5 + -1) =
             *(undefined1 *)((long)blob + lVar5 + ~(long)(int)uVar2);
        lVar5 = lVar1;
      } while ((int)uVar2 < lVar1);
    }
    if (0 < (int)uVar2) {
      memset(blob,0,(ulong)uVar2);
    }
    if (0 < nbytes && (c & 7U) != 0) {
      uVar4 = (ulong)(nbytes - 1U);
      uVar2 = (uint)*(byte *)((long)blob + uVar4);
      if (nbytes - 1U != 0) {
        uVar3 = uVar2;
        do {
          uVar2 = (uint)*(byte *)((long)blob + (uVar4 - 1));
          *(char *)((long)blob + uVar4) = (char)(((uVar3 << 8 | uVar2) << ((byte)c & 7)) >> 8);
          uVar4 = uVar4 - 1;
          uVar3 = uVar2;
        } while (uVar4 != 0);
      }
      *(char *)((long)blob + uVar4) = (char)(((uVar2 << 8) << ((byte)c & 7)) >> 8);
    }
  }
  return;
}

Assistant:

void lshift8 ( void * blob, int nbytes, int c )
{
  uint8_t * k = (uint8_t*)blob;

  if(c == 0) return;

  int b = c >> 3;
  c &= 7;

  for(int i = nbytes-1; i >= b; i--)
  {
    k[i] = k[i-b];
  }

  for(int i = b-1; i >= 0; i--)
  {
    k[i] = 0;
  }

  if(c == 0) return;

  for(int i = nbytes-1; i >= 0; i--)
  {
    uint8_t a = k[i];
    uint8_t b = (i == 0) ? 0 : k[i-1];

    k[i] = (a << c) | (b >> (8-c));
  }
}